

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowFullScan(WindowCodeArg *p)

{
  int p1;
  Parse *pParse_00;
  Parse *pMWin_00;
  Vdbe *p_00;
  int p2;
  int iVar1;
  int p2_00;
  int p2_01;
  int p2_02;
  int local_6c;
  KeyInfo *local_68;
  KeyInfo *pKeyInfo;
  int addrEq;
  int addr;
  int csr;
  int addrNext;
  int lblBrk;
  int lblNext;
  int nPeer;
  int regPeer;
  int regRowid;
  int regCPeer;
  int regCRowid;
  Vdbe *v;
  Window *pMWin;
  Parse *pParse;
  Window *pWin;
  WindowCodeArg *p_local;
  
  pParse_00 = p->pParse;
  pMWin_00 = (Parse *)p->pMWin;
  p_00 = p->pVdbe;
  regPeer = 0;
  lblNext = 0;
  p1 = *(int *)((long)&pMWin_00->pConstExpr + 4);
  if (*(ExprList **)&pMWin_00->rc == (ExprList *)0x0) {
    local_6c = 0;
  }
  else {
    local_6c = (*(ExprList **)&pMWin_00->rc)->nExpr;
  }
  p2 = sqlite3VdbeMakeLabel(pParse_00);
  iVar1 = sqlite3VdbeMakeLabel(pParse_00);
  p2_00 = sqlite3GetTempReg(pParse_00);
  p2_01 = sqlite3GetTempReg(pParse_00);
  if (local_6c != 0) {
    regPeer = sqlite3GetTempRange(pParse_00,local_6c);
    lblNext = sqlite3GetTempRange(pParse_00,local_6c);
  }
  sqlite3VdbeAddOp2(p_00,0x80,*(int *)&pMWin_00->aLabel,p2_00);
  windowReadPeerValues(p,*(int *)&pMWin_00->aLabel,regPeer);
  for (pParse = pMWin_00; pParse != (Parse *)0x0; pParse = *(Parse **)&pParse->nMem) {
    sqlite3VdbeAddOp2(p_00,0x49,0,*(int *)((long)&pParse->aLabel + 4));
  }
  sqlite3VdbeAddOp3(p_00,0x18,p1,iVar1,pMWin_00->regRoot);
  p2_02 = sqlite3VdbeCurrentAddr(p_00);
  sqlite3VdbeAddOp2(p_00,0x80,p1,p2_01);
  sqlite3VdbeAddOp3(p_00,0x36,pMWin_00->nMaxArg,iVar1,p2_01);
  if (pMWin_00->disableLookaside == 'R') {
    sqlite3VdbeAddOp3(p_00,0x35,p2_00,p2,p2_01);
  }
  else if (pMWin_00->disableLookaside != 'B') {
    pKeyInfo._4_4_ = 0;
    local_68 = (KeyInfo *)0x0;
    if (*(ExprList **)&pMWin_00->rc != (ExprList *)0x0) {
      local_68 = sqlite3KeyInfoFromExprList(pParse_00,*(ExprList **)&pMWin_00->rc,0,0);
    }
    if (pMWin_00->disableLookaside == '[') {
      pKeyInfo._4_4_ = sqlite3VdbeAddOp3(p_00,0x35,p2_00,0,p2_01);
    }
    if (local_68 == (KeyInfo *)0x0) {
      sqlite3VdbeAddOp2(p_00,0xb,0,p2);
    }
    else {
      windowReadPeerValues(p,p1,lblNext);
      sqlite3VdbeAddOp3(p_00,0x57,lblNext,regPeer,local_6c);
      sqlite3VdbeAppendP4(p_00,local_68,-9);
      iVar1 = sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp3(p_00,0x10,iVar1 + 1,p2,iVar1 + 1);
    }
    if (pKeyInfo._4_4_ != 0) {
      sqlite3VdbeJumpHere(p_00,pKeyInfo._4_4_);
    }
  }
  windowAggStep(pParse_00,(Window *)pMWin_00,p1,0,p->regArg);
  sqlite3VdbeResolveLabel(p_00,p2);
  sqlite3VdbeAddOp2(p_00,5,p1,p2_02);
  sqlite3VdbeJumpHere(p_00,p2_02 + -1);
  sqlite3VdbeJumpHere(p_00,p2_02 + 1);
  sqlite3ReleaseTempReg(pParse_00,p2_01);
  sqlite3ReleaseTempReg(pParse_00,p2_00);
  if (local_6c != 0) {
    sqlite3ReleaseTempRange(pParse_00,lblNext,local_6c);
    sqlite3ReleaseTempRange(pParse_00,regPeer,local_6c);
  }
  windowAggFinal(p,1);
  return;
}

Assistant:

static void windowFullScan(WindowCodeArg *p){
  Window *pWin;
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  Vdbe *v = p->pVdbe;

  int regCRowid = 0;              /* Current rowid value */
  int regCPeer = 0;               /* Current peer values */
  int regRowid = 0;               /* AggStep rowid value */
  int regPeer = 0;                /* AggStep peer values */

  int nPeer;
  int lblNext;
  int lblBrk;
  int addrNext;
  int csr = pMWin->csrApp;

  nPeer = (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);

  lblNext = sqlite3VdbeMakeLabel(pParse);
  lblBrk = sqlite3VdbeMakeLabel(pParse);

  regCRowid = sqlite3GetTempReg(pParse);
  regRowid = sqlite3GetTempReg(pParse);
  if( nPeer ){
    regCPeer = sqlite3GetTempRange(pParse, nPeer);
    regPeer = sqlite3GetTempRange(pParse, nPeer);
  }

  sqlite3VdbeAddOp2(v, OP_Rowid, pMWin->iEphCsr, regCRowid);
  windowReadPeerValues(p, pMWin->iEphCsr, regCPeer);

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
  }

  sqlite3VdbeAddOp3(v, OP_SeekGE, csr, lblBrk, pMWin->regStartRowid);
  VdbeCoverage(v);
  addrNext = sqlite3VdbeCurrentAddr(v);
  sqlite3VdbeAddOp2(v, OP_Rowid, csr, regRowid);
  sqlite3VdbeAddOp3(v, OP_Gt, pMWin->regEndRowid, lblBrk, regRowid);
  VdbeCoverageNeverNull(v);

  if( pMWin->eExclude==TK_CURRENT ){
    sqlite3VdbeAddOp3(v, OP_Eq, regCRowid, lblNext, regRowid);
    VdbeCoverageNeverNull(v);
  }else if( pMWin->eExclude!=TK_NO ){
    int addr;
    int addrEq = 0;
    KeyInfo *pKeyInfo = 0;

    if( pMWin->pOrderBy ){
      pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pMWin->pOrderBy, 0, 0);
    }
    if( pMWin->eExclude==TK_TIES ){
      addrEq = sqlite3VdbeAddOp3(v, OP_Eq, regCRowid, 0, regRowid);
      VdbeCoverageNeverNull(v);
    }
    if( pKeyInfo ){
      windowReadPeerValues(p, csr, regPeer);
      sqlite3VdbeAddOp3(v, OP_Compare, regPeer, regCPeer, nPeer);
      sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
      addr = sqlite3VdbeCurrentAddr(v)+1;
      sqlite3VdbeAddOp3(v, OP_Jump, addr, lblNext, addr);
      VdbeCoverageEqNe(v);
    }else{
      sqlite3VdbeAddOp2(v, OP_Goto, 0, lblNext);
    }
    if( addrEq ) sqlite3VdbeJumpHere(v, addrEq);
  }

  windowAggStep(pParse, pMWin, csr, 0, p->regArg);

  sqlite3VdbeResolveLabel(v, lblNext);
  sqlite3VdbeAddOp2(v, OP_Next, csr, addrNext);
  VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addrNext-1);
  sqlite3VdbeJumpHere(v, addrNext+1);
  sqlite3ReleaseTempReg(pParse, regRowid);
  sqlite3ReleaseTempReg(pParse, regCRowid);
  if( nPeer ){
    sqlite3ReleaseTempRange(pParse, regPeer, nPeer);
    sqlite3ReleaseTempRange(pParse, regCPeer, nPeer);
  }

  windowAggFinal(p, 1);
}